

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O3

cmpresult_t uECC_vli_cmp(uECC_word_t *left,uECC_word_t *right,wordcount_t num_words)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uECC_word_t tmp [4];
  
  if ('\0' < num_words) {
    uVar2 = 0;
    uVar3 = 0;
    do {
      uVar4 = right[uVar2] + uVar3;
      uVar1 = (ulong)(left[uVar2] < uVar4);
      if (uVar4 == 0) {
        uVar1 = uVar3;
      }
      tmp[uVar2] = left[uVar2] - uVar4;
      uVar2 = uVar2 + 1;
      uVar3 = uVar1;
    } while ((byte)num_words != uVar2);
    uVar3 = 0;
    uVar2 = 0;
    do {
      uVar2 = uVar2 | tmp[uVar3];
      uVar3 = uVar3 + 1;
    } while ((byte)num_words != uVar3);
    return (uVar2 != 0) + (char)uVar1 * -2;
  }
  return '\0';
}

Assistant:

uECC_VLI_API uECC_word_t uECC_vli_sub(uECC_word_t *result,
                                      const uECC_word_t *left,
                                      const uECC_word_t *right,
                                      wordcount_t num_words) {
    uECC_word_t borrow = 0;
    wordcount_t i;
    for (i = 0; i < num_words; ++i) {
        uECC_word_t diff = left[i] - right[i] - borrow;
        if (diff != left[i]) {
            borrow = (diff > left[i]);
        }
        result[i] = diff;
    }
    return borrow;
}